

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numrange.cc
# Opt level: O0

void test_numrange(char *range)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  reference piVar4;
  iterator iStack_50;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> result;
  char *range_local;
  
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)range;
  if (range == (char *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"null");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)local_28,range,0xf);
    poVar3 = std::operator<<((ostream *)&std::cout,"numeric range ");
    poVar3 = std::operator<<(poVar3,(char *)result.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3," ->");
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_28);
    iStack_50 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar1 = *piVar4;
      poVar3 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<(poVar3,iVar1);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  }
  return;
}

Assistant:

static void
test_numrange(char const* range)
{
    if (range == nullptr) {
        std::cout << "null" << std::endl;
    } else {
        std::vector<int> result = QUtil::parse_numrange(range, 15);
        std::cout << "numeric range " << range << " ->";
        for (int i: result) {
            std::cout << " " << i;
        }
        std::cout << std::endl;
    }
}